

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::SignFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  bool bVar2;
  LogicalTypeId LVar3;
  ScalarFunctionSet *in_RDI;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  ScalarFunctionSet *sign;
  ScalarFunction *in_stack_fffffffffffffd48;
  ScalarFunction *in_stack_fffffffffffffd50;
  LogicalType *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  LogicalType *local_248;
  LogicalType local_220 [24];
  undefined1 local_208 [16];
  LogicalType *in_stack_fffffffffffffe08;
  LogicalType local_1e8 [32];
  LogicalType *local_1c8;
  LogicalType local_1c0 [24];
  LogicalType *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [24];
  ScalarFunction local_180;
  LogicalType *local_58;
  LogicalType *local_50;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_48 [3];
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::Numeric();
  local_18 = local_30;
  local_48[0]._M_current =
       (LogicalType *)
       std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  in_stack_fffffffffffffd48);
  local_50 = (LogicalType *)
             std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                        in_stack_fffffffffffffd48);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffd50,
                            (__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffd48), bVar2) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
               ::operator*(local_48);
    LVar3 = LogicalType::id(local_58);
    if (LVar3 != DECIMAL) {
      local_1c8 = local_1c0;
      duckdb::LogicalType::LogicalType(local_1c8,local_58);
      local_1a8 = local_1c0;
      local_1a0 = 1;
      std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xdc3b8d);
      iVar1._M_len._0_4_ = in_stack_fffffffffffffd60;
      iVar1._M_array = in_stack_fffffffffffffd58;
      iVar1._M_len._4_4_ = in_stack_fffffffffffffd64;
      vector<duckdb::LogicalType,_true>::vector
                ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffd50,iVar1,
                 (allocator_type *)in_stack_fffffffffffffd48);
      duckdb::LogicalType::LogicalType(local_1e8,TINYINT);
      ScalarFunction::GetScalarUnaryFunctionFixedReturn<signed_char,duckdb::SignOperator>
                (in_stack_fffffffffffffe08);
      duckdb::LogicalType::LogicalType(local_220,INVALID);
      in_stack_fffffffffffffd58 = local_220;
      in_stack_fffffffffffffd60 = 0;
      in_stack_fffffffffffffd50 = (ScalarFunction *)0x0;
      in_stack_fffffffffffffd48 = (ScalarFunction *)0x0;
      duckdb::ScalarFunction::ScalarFunction(&local_180,local_198,local_1e8,local_208,0);
      FunctionSet<duckdb::ScalarFunction>::AddFunction
                ((FunctionSet<duckdb::ScalarFunction> *)in_stack_fffffffffffffd50,
                 in_stack_fffffffffffffd48);
      ScalarFunction::~ScalarFunction(in_stack_fffffffffffffd50);
      duckdb::LogicalType::~LogicalType(local_220);
      std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
      ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *
                )0xdc3c8e);
      duckdb::LogicalType::~LogicalType(local_1e8);
      vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdc3ca8);
      std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xdc3cb5);
      local_248 = (LogicalType *)&local_1a8;
      do {
        local_248 = local_248 + -0x18;
        duckdb::LogicalType::~LogicalType(local_248);
      } while (local_248 != local_1c0);
    }
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(local_48);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xdc3ace);
  return in_RDI;
}

Assistant:

ScalarFunctionSet SignFun::GetFunctions() {
	ScalarFunctionSet sign;
	for (auto &type : LogicalType::Numeric()) {
		if (type.id() == LogicalTypeId::DECIMAL) {
			continue;
		} else {
			sign.AddFunction(
			    ScalarFunction({type}, LogicalType::TINYINT,
			                   ScalarFunction::GetScalarUnaryFunctionFixedReturn<int8_t, SignOperator>(type)));
		}
	}
	return sign;
}